

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::conditionalizeExpensiveOnBitwise
          (OptimizeInstructions *this,Binary *binary)

{
  Id IVar1;
  PassRunner *pPVar2;
  Module *this_00;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Const *pCVar8;
  If *pIVar9;
  Builder BVar10;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_01;
  ulong in_R8;
  Builder ifTrue;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  undefined1 local_330 [8];
  EffectAnalyzer leftEffects;
  EffectAnalyzer rightEffects;
  anon_union_16_6_1532cd5a_for_Literal_0 local_58;
  undefined8 local_48;
  Builder local_40;
  Builder builder;
  
  pPVar2 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  if ((pPVar2->options).optimizeLevel < 2) {
    return (Expression *)(If *)0x0;
  }
  if (0 < (pPVar2->options).shrinkLevel) {
    return (Expression *)(If *)0x0;
  }
  if (1 < binary->op - AndInt32) {
    __assert_fail("binary->op == AndInt32 || binary->op == OrInt32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xd6c,
                  "Expression *wasm::OptimizeInstructions::conditionalizeExpensiveOnBitwise(Binary *)"
                 );
  }
  this_00 = (Module *)binary->right;
  if (*(Id *)&(this_00->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == ConstId) {
    return (Expression *)(If *)0x0;
  }
  builder.wasm = (Module *)binary->left;
  IVar1 = *(Id *)&((builder.wasm)->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  if (IVar1 < RefEqId) {
    if (IVar1 == UnaryId) {
      bVar3 = Unary::isRelational((Unary *)builder.wasm);
    }
    else {
      if (IVar1 != BinaryId) {
        if (IVar1 != RefIsNullId) {
          return (Expression *)(If *)0x0;
        }
        goto LAB_009ead10;
      }
      bVar3 = Binary::isRelational((Binary *)builder.wasm);
    }
LAB_009ead0c:
    if (bVar3 == false) {
      return (Expression *)(If *)0x0;
    }
  }
  else if ((IVar1 != RefEqId) && (IVar1 != RefTestId)) {
    if (IVar1 != StringEqId) {
      return (Expression *)(If *)0x0;
    }
    bVar3 = *(int *)&((builder.wasm)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage == 0;
    goto LAB_009ead0c;
  }
LAB_009ead10:
  IVar1 = *(Id *)&(this_00->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  if (IVar1 < RefEqId) {
    if (IVar1 == UnaryId) {
      bVar3 = Unary::isRelational((Unary *)this_00);
    }
    else {
      if (IVar1 != BinaryId) {
        if (IVar1 != RefIsNullId) {
          return (Expression *)(If *)0x0;
        }
        goto LAB_009ead65;
      }
      bVar3 = Binary::isRelational((Binary *)this_00);
    }
LAB_009ead5d:
    if (bVar3 == false) {
      return (Expression *)(If *)0x0;
    }
  }
  else if ((IVar1 != RefEqId) && (IVar1 != RefTestId)) {
    if (IVar1 != StringEqId) {
      return (Expression *)(If *)0x0;
    }
    bVar3 = *(int *)&(this_00->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage == 0;
    goto LAB_009ead5d;
  }
LAB_009ead65:
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)local_330,
             &((this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).super_Pass.runner)->options,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule,(Expression *)builder.wasm);
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)
             &leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &((this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).super_Pass.runner)->options,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule,(Expression *)this_00);
  bVar4 = true;
  bVar3 = true;
  if (leftEffects.readsMemory == false) {
    bVar3 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)local_330);
  }
  if (rightEffects.readsMemory == false) {
    bVar4 = EffectAnalyzer::hasNonTrapSideEffects
                      ((EffectAnalyzer *)
                       &leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                      );
  }
  if ((bVar3 & bVar4) == 0) {
    BVar10.wasm = this_00;
    if (bVar4 == false) {
      if (bVar3 == false) {
        uVar6 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                          ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)&local_40,
                           (Expression *)builder.wasm);
        uVar7 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                          ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)&local_40,
                           (Expression *)this_00);
        uVar5 = uVar7;
        if (uVar7 < uVar6) {
          uVar5 = uVar6;
        }
        if (6 < uVar5) {
          ifTrue = builder;
          if (uVar6 <= uVar7) {
            BVar10 = builder;
            ifTrue.wasm = this_00;
          }
          goto LAB_009eaf31;
        }
      }
      else {
        uVar5 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                          ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)&local_40,
                           (Expression *)this_00);
        BVar10 = builder;
        ifTrue.wasm = this_00;
        if (6 < uVar5) {
LAB_009eaf31:
          local_40.wasm =
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule;
          if (binary->op == OrInt32) {
            rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
            pCVar8 = Builder::makeConst(&local_40,
                                        (Literal *)
                                        &rightEffects.delegateTargets._M_t._M_impl.
                                         super__Rb_tree_header._M_node_count);
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
            pIVar9 = Builder::makeIf(&local_40,(Expression *)BVar10.wasm,(Expression *)pCVar8,
                                     (Expression *)ifTrue.wasm,type);
            this_01 = (anon_union_16_6_1532cd5a_for_Literal_0 *)
                      &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
            ;
          }
          else {
            local_58.i32 = 0;
            local_48 = 2;
            pCVar8 = Builder::makeConst(&local_40,(Literal *)&local_58.func);
            type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
            pIVar9 = Builder::makeIf(&local_40,(Expression *)BVar10.wasm,(Expression *)ifTrue.wasm,
                                     (Expression *)pCVar8,type_00);
            this_01 = &local_58;
          }
          Literal::~Literal((Literal *)&this_01->func);
          goto LAB_009eade8;
        }
      }
    }
    else {
      uVar5 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                        ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)&local_40,
                         (Expression *)builder.wasm);
      if ((6 < uVar5) &&
         (bVar3 = EffectAnalyzer::invalidates
                            ((EffectAnalyzer *)local_330,
                             (EffectAnalyzer *)
                             &leftEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count), ifTrue = builder, !bVar3)) goto LAB_009eaf31;
    }
  }
  pIVar9 = (If *)0x0;
LAB_009eade8:
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&rightEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&rightEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&rightEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&rightEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&rightEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&rightEffects.features);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&leftEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&leftEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&leftEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&leftEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&leftEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&leftEffects.features);
  return (Expression *)pIVar9;
}

Assistant:

Expression* conditionalizeExpensiveOnBitwise(Binary* binary) {
    // this operation can increase code size, so don't always do it
    auto& options = getPassRunner()->options;
    if (options.optimizeLevel < 2 || options.shrinkLevel > 0) {
      return nullptr;
    }
    const auto MIN_COST = 7;
    assert(binary->op == AndInt32 || binary->op == OrInt32);
    if (binary->right->is<Const>()) {
      return nullptr; // trivial
    }
    // bitwise logical operator on two non-numerical values, check if they are
    // boolean
    auto* left = binary->left;
    auto* right = binary->right;
    if (!Properties::emitsBoolean(left) || !Properties::emitsBoolean(right)) {
      return nullptr;
    }
    auto leftEffects = effects(left);
    auto rightEffects = effects(right);
    auto leftHasSideEffects = leftEffects.hasSideEffects();
    auto rightHasSideEffects = rightEffects.hasSideEffects();
    if (leftHasSideEffects && rightHasSideEffects) {
      return nullptr; // both must execute
    }
    // canonicalize with side effects, if any, happening on the left
    if (rightHasSideEffects) {
      if (CostAnalyzer(left).cost < MIN_COST) {
        return nullptr; // avoidable code is too cheap
      }
      if (leftEffects.invalidates(rightEffects)) {
        return nullptr; // cannot reorder
      }
      std::swap(left, right);
    } else if (leftHasSideEffects) {
      if (CostAnalyzer(right).cost < MIN_COST) {
        return nullptr; // avoidable code is too cheap
      }
    } else {
      // no side effects, reorder based on cost estimation
      auto leftCost = CostAnalyzer(left).cost;
      auto rightCost = CostAnalyzer(right).cost;
      if (std::max(leftCost, rightCost) < MIN_COST) {
        return nullptr; // avoidable code is too cheap
      }
      // canonicalize with expensive code on the right
      if (leftCost > rightCost) {
        std::swap(left, right);
      }
    }
    // worth it! perform conditionalization
    Builder builder(*getModule());
    if (binary->op == OrInt32) {
      return builder.makeIf(
        left, builder.makeConst(Literal(int32_t(1))), right);
    } else { // &
      return builder.makeIf(
        left, right, builder.makeConst(Literal(int32_t(0))));
    }
  }